

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O1

void SndEmu_FreeDevLinkData(DEV_INFO *devInf)

{
  long lVar1;
  ulong uVar2;
  
  if (devInf->linkDevCount != 0) {
    if (devInf->linkDevCount != 0) {
      lVar1 = 8;
      uVar2 = 0;
      do {
        free(*(void **)(&devInf->linkDevs->devID + lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < devInf->linkDevCount);
    }
    free(devInf->linkDevs);
    devInf->linkDevs = (DEVLINK_INFO *)0x0;
    devInf->linkDevCount = 0;
  }
  return;
}

Assistant:

void SndEmu_FreeDevLinkData(DEV_INFO* devInf)
{
	UINT32 curLDev;
	
	if (! devInf->linkDevCount)
		return;
	
	for (curLDev = 0; curLDev < devInf->linkDevCount; curLDev ++)
		free(devInf->linkDevs[curLDev].cfg);
	free(devInf->linkDevs);	devInf->linkDevs = NULL;
	devInf->linkDevCount = 0;
	
	return;
}